

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_markers.cpp
# Opt level: O0

string * get_path_from_template
                   (string *__return_storage_ptr__,string *template_string,string *file_name,
                   uint64_t time,uint64_t number)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  string local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  string local_340 [32];
  string local_320 [32];
  undefined1 local_300 [8];
  string c_2;
  string b_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  string local_260 [32];
  string local_240 [32];
  undefined1 local_220 [8];
  string c_1;
  string b_1;
  size_t num_pos;
  size_t time_pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string local_190 [32];
  string local_170 [32];
  undefined1 local_150 [8];
  string c;
  string b;
  size_t rep_pos;
  long local_e8;
  size_t poss;
  string rep_name;
  string local_b8 [8];
  string rep_str;
  string local_90 [8];
  string time_str;
  allocator<char> local_59;
  string local_58 [8];
  string number_str;
  uint64_t number_local;
  uint64_t time_local;
  string *file_name_local;
  string *template_string_local;
  string *out_string;
  
  number_str.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"$Number$",&local_59);
  std::allocator<char>::~allocator(&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_90,"$Time$",(allocator<char> *)(rep_str.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(rep_str.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b8,"$RepresentationID$",(allocator<char> *)(rep_name.field_2._M_local_buf + 0xf))
  ;
  std::allocator<char>::~allocator((allocator<char> *)(rep_name.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)&poss);
  lVar1 = std::__cxx11::string::size();
  if ((lVar1 != 0) &&
     (local_e8 = std::__cxx11::string::find_last_of((char *)file_name,0x12a091), local_e8 != -1)) {
    std::__cxx11::string::substr((ulong)&rep_pos,(ulong)file_name);
    std::__cxx11::string::operator=((string *)&poss,(string *)&rep_pos);
    std::__cxx11::string::~string((string *)&rep_pos);
  }
  lVar1 = std::__cxx11::string::find_first_of((string *)template_string,(ulong)local_b8);
  if (lVar1 != -1) {
    std::__cxx11::string::string((string *)(c.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_150);
    if (lVar1 != 0) {
      std::__cxx11::string::substr((ulong)local_170,(ulong)template_string);
      std::__cxx11::string::operator=((string *)(c.field_2._M_local_buf + 8),local_170);
      std::__cxx11::string::~string(local_170);
    }
    lVar2 = std::__cxx11::string::size();
    uVar3 = std::__cxx11::string::size();
    if ((ulong)(lVar1 + lVar2) < uVar3) {
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)local_190,(ulong)template_string);
      std::__cxx11::string::operator=((string *)local_150,local_190);
      std::__cxx11::string::~string(local_190);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&time_pos,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&c.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&poss);
    std::operator+(&local_1b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&time_pos,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&time_pos);
    std::__cxx11::string::~string((string *)local_150);
    std::__cxx11::string::~string((string *)(c.field_2._M_local_buf + 8));
  }
  lVar1 = std::__cxx11::string::find((string *)__return_storage_ptr__,(ulong)local_90);
  lVar2 = std::__cxx11::string::find((string *)__return_storage_ptr__,(ulong)local_58);
  if (lVar1 == -1) {
    if (lVar2 != -1) {
      std::__cxx11::string::string((string *)(c_2.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)local_300);
      if (lVar2 != 0) {
        std::__cxx11::string::substr((ulong)local_320,(ulong)__return_storage_ptr__);
        std::__cxx11::string::operator=((string *)(c_2.field_2._M_local_buf + 8),local_320);
        std::__cxx11::string::~string(local_320);
      }
      lVar1 = std::__cxx11::string::size();
      uVar3 = std::__cxx11::string::size();
      if ((ulong)(lVar2 + lVar1) < uVar3) {
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)local_340,(ulong)__return_storage_ptr__);
        std::__cxx11::string::operator=((string *)local_300,local_340);
        std::__cxx11::string::~string(local_340);
      }
      std::__cxx11::to_string(&local_3a0,number);
      std::operator+(&local_380,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&c_2.field_2 + 8),&local_3a0);
      std::operator+(&local_360,&local_380,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_300)
      ;
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_360);
      std::__cxx11::string::~string((string *)&local_360);
      std::__cxx11::string::~string((string *)&local_380);
      std::__cxx11::string::~string((string *)&local_3a0);
      std::__cxx11::string::~string((string *)local_300);
      std::__cxx11::string::~string((string *)(c_2.field_2._M_local_buf + 8));
    }
  }
  else {
    std::__cxx11::string::string((string *)(c_1.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_220);
    if (lVar1 != 0) {
      std::__cxx11::string::substr((ulong)local_240,(ulong)__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)(c_1.field_2._M_local_buf + 8),local_240);
      std::__cxx11::string::~string(local_240);
    }
    lVar2 = std::__cxx11::string::size();
    uVar3 = std::__cxx11::string::size();
    if ((ulong)(lVar1 + lVar2) < uVar3) {
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)local_260,(ulong)__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)local_220,local_260);
      std::__cxx11::string::~string(local_260);
    }
    std::__cxx11::to_string((string *)((long)&b_2.field_2 + 8),time);
    std::operator+(&local_2a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&c_1.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&b_2.field_2 + 8));
    std::operator+(&local_280,&local_2a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)(b_2.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_220);
    std::__cxx11::string::~string((string *)(c_1.field_2._M_local_buf + 8));
  }
  number_str.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)&poss);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_58);
  if ((number_str.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_path_from_template(
    std::string& template_string,
    std::string& file_name,
    uint64_t time,
    uint64_t number)
{
    std::string out_string;

    const std::string number_str = "$Number$";
    const std::string time_str = "$Time$";
    const std::string rep_str = "$RepresentationID$";

    std::string rep_name;

    if (file_name.size() > 0)
    {
        size_t poss = file_name.find_last_of(".");
        if (poss != std::string::npos)
            rep_name = file_name.substr(0, poss);
    }

    size_t rep_pos = template_string.find_first_of(rep_str);

    if (rep_pos != std::string::npos)
    {
        std::string b, c;

        if (rep_pos != 0)
            b = template_string.substr(0, rep_pos);

        if (rep_pos + rep_str.size() < template_string.size())
            c = template_string.substr(rep_pos + rep_str.size());

        out_string = b + rep_name + c;
    }

    size_t time_pos = out_string.find(time_str);
    size_t num_pos = out_string.find(number_str);

    if (time_pos != std::string::npos)
    {
        std::string b, c;

        if (time_pos != 0)
            b = out_string.substr(0, time_pos);

        if (time_pos + time_str.size() < out_string.size())
            c = out_string.substr(time_pos + time_str.size());

        out_string = b + std::to_string(time) + c;
    }
    else if (num_pos != std::string::npos)
    {
        std::string b, c;

        if (num_pos != 0)
            b = out_string.substr(0, num_pos);

        if (num_pos + number_str.size() < out_string.size())
            c = out_string.substr(num_pos + number_str.size());

        out_string = b + std::to_string(number) + c;
    }

    return out_string;
}